

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPub.c
# Opt level: O2

void sbfPub_destroy(sbfPub pub)

{
  sbfLog psVar1;
  char *pcVar2;
  
  if (pub->mDestroyed != 0) {
    return;
  }
  pub->mDestroyed = 1;
  psVar1 = pub->mTport->mLog;
  pcVar2 = sbfTopic_getTopic(pub->mTopic);
  sbfLog_log(psVar1,0,"queueing remove of publisher %p (%s)",pub,pcVar2);
  sbfMw_enqueueThread(pub->mTportStream->mThread,&pub->mEventRemove,sbfPubRemoveEventCb,pub);
  return;
}

Assistant:

void
sbfPub_destroy (sbfPub pub)
{
    if (pub->mDestroyed)
        return;
    pub->mDestroyed = 1;

    sbfLog_debug (pub->mTport->mLog,
                  "queueing remove of publisher %p (%s)",
                  pub,
                  sbfTopic_getTopic (pub->mTopic));

    sbfMw_enqueueThread (pub->mTportStream->mThread,
                         &pub->mEventRemove,
                         sbfPubRemoveEventCb,
                         pub);
}